

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botl.c
# Opt level: O3

int title_to_mon(char *str,int *rank_indx,int *title_length)

{
  char *pcVar1;
  short sVar2;
  int iVar3;
  size_t sVar4;
  Role *pRVar5;
  long lVar6;
  char **ppcVar7;
  long lVar8;
  char **ppcVar9;
  
  pRVar5 = roles;
  ppcVar7 = &roles[0].rank[0].f;
  lVar6 = 0;
  do {
    lVar8 = 0;
    ppcVar9 = ppcVar7;
    do {
      pcVar1 = ((RoleName *)(ppcVar9 + -1))->m;
      if (pcVar1 != (char *)0x0) {
        sVar4 = strlen(pcVar1);
        iVar3 = strncasecmp(str,pcVar1,sVar4);
        if (iVar3 == 0) {
          if (rank_indx != (int *)0x0) {
            *rank_indx = (int)lVar8;
          }
          if (title_length != (int *)0x0) {
            sVar4 = strlen(pcVar1);
            *title_length = (int)sVar4;
          }
          return (int)pRVar5->malenum;
        }
      }
      pcVar1 = *ppcVar9;
      if (pcVar1 != (char *)0x0) {
        sVar4 = strlen(pcVar1);
        iVar3 = strncasecmp(str,pcVar1,sVar4);
        if (iVar3 == 0) {
          if (rank_indx != (int *)0x0) {
            *rank_indx = (int)lVar8;
          }
          if (title_length != (int *)0x0) {
            sVar4 = strlen(pcVar1);
            *title_length = (int)sVar4;
          }
          sVar2 = pRVar5->femalenum;
          if (sVar2 == -1) {
            sVar2 = pRVar5->malenum;
          }
          return (int)sVar2;
        }
      }
      lVar8 = lVar8 + 1;
      ppcVar9 = ppcVar9 + 2;
    } while (lVar8 != 9);
    lVar6 = lVar6 + 1;
    pRVar5 = roles + lVar6;
    ppcVar7 = ppcVar7 + 0x23;
  } while (roles[lVar6].name.m != (char *)0x0);
  return -1;
}

Assistant:

int title_to_mon(const char *str, int *rank_indx, int *title_length)
{
	int i, j;


	/* Loop through each of the roles */
	for (i = 0; roles[i].name.m; i++)
	    for (j = 0; j < 9; j++) {
	    	if (roles[i].rank[j].m && !strncmpi(str,
	    			roles[i].rank[j].m, strlen(roles[i].rank[j].m))) {
	    	    if (rank_indx) *rank_indx = j;
	    	    if (title_length) *title_length = strlen(roles[i].rank[j].m);
	    	    return roles[i].malenum;
	    	}
	    	if (roles[i].rank[j].f && !strncmpi(str,
	    			roles[i].rank[j].f, strlen(roles[i].rank[j].f))) {
	    	    if (rank_indx) *rank_indx = j;
	    	    if (title_length) *title_length = strlen(roles[i].rank[j].f);
	    	    return ((roles[i].femalenum != NON_PM) ?
	    	    		roles[i].femalenum : roles[i].malenum);
	    	}
	    }
	return NON_PM;
}